

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O0

result<unsigned_long> * __thiscall
sockpp::stream_socket::read_n
          (result<unsigned_long> *__return_storage_ptr__,stream_socket *this,void *buf,size_t n)

{
  bool bVar1;
  error_code *err;
  unsigned_long *puVar2;
  bool local_69;
  errc local_4c;
  undefined1 local_48 [8];
  result<unsigned_long> res;
  size_t nx;
  uint8_t *b;
  size_t n_local;
  void *buf_local;
  stream_socket *this_local;
  
  res.err_._M_cat = (error_category *)0x0;
  while( true ) {
    if (n <= res.err_._M_cat) {
      result<unsigned_long>::result(__return_storage_ptr__,(unsigned_long *)&res.err_._M_cat);
      return __return_storage_ptr__;
    }
    (*(this->super_socket)._vptr_socket[6])
              (local_48,this,(error_category *)((long)buf + (long)res.err_._M_cat),
               n - (long)res.err_._M_cat);
    bVar1 = sockpp::result::operator_cast_to_bool((result *)local_48);
    local_69 = false;
    if (!bVar1) {
      local_4c = interrupted;
      local_69 = operator!=((result<unsigned_long> *)local_48,&local_4c);
    }
    if (local_69 != false) break;
    puVar2 = result<unsigned_long>::value((result<unsigned_long> *)local_48);
    res.err_._M_cat = res.err_._M_cat + *puVar2;
  }
  err = result<unsigned_long>::error((result<unsigned_long> *)local_48);
  result<unsigned_long>::result(__return_storage_ptr__,err);
  return __return_storage_ptr__;
}

Assistant:

result<size_t> stream_socket::read_n(void* buf, size_t n) {
    uint8_t* b = reinterpret_cast<uint8_t*>(buf);
    size_t nx = 0;

    while (nx < n) {
        auto res = read(b + nx, n - nx);
        if (!res && res != errc::interrupted)
            return res.error();

        nx += size_t(res.value());
    }

    return nx;
}